

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O3

void trun::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *strings,char *strInput,int splitChar)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  size_type __n;
  void *pvVar3;
  long lVar4;
  ulong __pos;
  string str;
  string input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  int local_7c;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = strings;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,strInput,(allocator<char> *)&local_a0);
  local_7c = (int)(char)splitChar;
  paVar1 = &local_78.field_2;
  __pos = 0;
  do {
    _Var2._M_p = local_50._M_dataplus._M_p;
    __n = local_50._M_string_length - __pos;
    if (local_50._M_string_length < __pos || __n == 0) {
LAB_0015fb5a:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_a0,&local_50,__pos,__n);
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\t\n\v\f\r ","");
      trim(&local_a0,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (local_a0._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_58,&local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      break;
    }
    __n = local_50._M_string_length - __pos;
    pvVar3 = memchr(local_50._M_dataplus._M_p + __pos,local_7c,__n);
    if ((pvVar3 == (void *)0x0) || (lVar4 = (long)pvVar3 - (long)_Var2._M_p, lVar4 == -1))
    goto LAB_0015fb5a;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_a0,&local_50,__pos,lVar4 - __pos);
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\t\n\v\f\r ","");
    trim(&local_a0,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_a0._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_58,&local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    __pos = lVar4 + 1;
  } while (__pos != 0xffffffffffffffff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void split(std::vector<std::string> &strings, const char *strInput, int splitChar) {
      std::string input(strInput);
      size_t iPos = 0;
      while(iPos != std::string::npos)
      {
          size_t iStart = iPos;
          iPos = input.find(splitChar,iPos);
          if (iPos != std::string::npos)
          {
              std::string str = input.substr(iStart, iPos-iStart);
              trim(str);
              if (str.length() > 0) {
                strings.push_back(str);
              }
              iPos++;
          } else
          {
              std::string str = input.substr(iStart, input.length()-iStart);
              trim(str);
              if (str.length() > 0) {
                strings.push_back(str);
              }
          }
      }
    }